

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::GenerateSymbolTest
          (Lowerer *this,RegOpnd *srcReg,Instr *insertInstr,LabelInstr *labelHelper,
          LabelInstr *continueLabel,bool generateObjectCheck)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  IndirOpnd *compareSrc1;
  undefined4 extraout_var;
  AddrOpnd *compareSrc2;
  OpCode branchOpCode;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  Lowerer *this_00;
  
  if (srcReg == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6ea1,"(srcReg)","srcReg");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_32 = (srcReg->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsSymbol((ValueType *)&local_32.field_0);
  if (!bVar2) {
    if (generateObjectCheck) {
      bVar2 = IR::Opnd::IsNotTaggedValue(&srcReg->super_Opnd);
      if (!bVar2) {
        LowererMD::GenerateObjectTest
                  (&this->m_lowererMD,&srcReg->super_Opnd,insertInstr,labelHelper,false);
      }
    }
    compareSrc1 = IR::IndirOpnd::New(srcReg,8,TyInt64,this->m_func,false);
    iVar3 = (*insertInstr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[9])();
    this_00 = (Lowerer *)CONCAT44(extraout_var,iVar3);
    compareSrc2 = IR::AddrOpnd::New((intptr_t)this_00,AddrOpndKindDynamicType,insertInstr->m_func,
                                    true,(Var)0x0);
    if (continueLabel == (LabelInstr *)0x0) {
      branchOpCode = BrNeq_A;
      continueLabel = labelHelper;
    }
    else {
      branchOpCode = BrEq_A;
    }
    InsertCompareBranch(this_00,&compareSrc1->super_Opnd,&compareSrc2->super_Opnd,branchOpCode,false
                        ,continueLabel,insertInstr,false);
  }
  return;
}

Assistant:

void
Lowerer::GenerateSymbolTest(IR::RegOpnd *srcReg, IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr * continueLabel, bool generateObjectCheck)
{
    Assert(srcReg);
    if (!srcReg->GetValueType().IsSymbol())
    {
        if (generateObjectCheck && !srcReg->IsNotTaggedValue())
        {
            this->m_lowererMD.GenerateObjectTest(srcReg, insertInstr, labelHelper);
        }

        // CMP [regSrcStr + offset(type)] , static symbol type   -- check base symbol type
        // BrEq/BrNeq labelHelper.
        IR::IndirOpnd * src1 = IR::IndirOpnd::New(srcReg, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func);
        IR::Opnd * src2 = this->LoadLibraryValueOpnd(insertInstr, LibraryValue::ValueSymbolTypeStatic);
        if (continueLabel)
        {
            InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, continueLabel, insertInstr);
        }
        else
        {
            InsertCompareBranch(src1, src2, Js::OpCode::BrNeq_A, labelHelper, insertInstr);
        }
    }
}